

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>::~QStringBuilder
          (QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray> *this)

{
  QByteArray::~QByteArray((QByteArray *)0x110190);
  QStringBuilder<const_QByteArray_&,_QByteArray>::~QStringBuilder
            ((QStringBuilder<const_QByteArray_&,_QByteArray> *)0x11019a);
  return;
}

Assistant:

~QStringBuilder() = default;